

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O0

int xferinfo_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
               curl_off_t ulnow)

{
  long lVar1;
  OperationConfig *config;
  per_transfer *per;
  curl_off_t ulnow_local;
  curl_off_t ultotal_local;
  curl_off_t dlnow_local;
  curl_off_t dltotal_local;
  void *clientp_local;
  
  lVar1 = *(long *)((long)clientp + 0x10);
  *(curl_off_t *)((long)clientp + 400) = dltotal;
  *(curl_off_t *)((long)clientp + 0x198) = dlnow;
  *(curl_off_t *)((long)clientp + 0x1a0) = ultotal;
  *(curl_off_t *)((long)clientp + 0x1a8) = ulnow;
  if ((*(byte *)((long)clientp + 0x1d8) >> 4 & 1) == 0) {
    if ((*(ulong *)(lVar1 + 0x4d4) >> 0x1d & 1) != 0) {
      *(ulong *)(lVar1 + 0x4d4) = *(ulong *)(lVar1 + 0x4d4) & 0xffffffffdfffffff;
      curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
    }
    clientp_local._4_4_ = 0;
  }
  else {
    clientp_local._4_4_ = 1;
  }
  return clientp_local._4_4_;
}

Assistant:

int xferinfo_cb(void *clientp,
                curl_off_t dltotal,
                curl_off_t dlnow,
                curl_off_t ultotal,
                curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  per->dltotal = dltotal;
  per->dlnow = dlnow;
  per->ultotal = ultotal;
  per->ulnow = ulnow;

  if(per->abort)
    return 1;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}